

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BST.hpp
# Opt level: O1

vector<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>_>_>
* __thiscall
supermap::BST<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>::extract
          (vector<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>_>_>
           *__return_storage_ptr__,
          BST<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *this)

{
  uchar *puVar1;
  _Rb_tree_node_base *p_Var2;
  KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_> KStack_b8;
  
  (__return_storage_ptr__->
  super__Vector_base<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (p_Var2 = (this->map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->map_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    puVar1 = *(uchar **)(p_Var2 + 5);
    *(undefined8 *)(p_Var2 + 5) = 0;
    memmove(&KStack_b8,p_Var2 + 1,0x80);
    KStack_b8.value.data_._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)
         (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)puVar1;
    std::
    vector<supermap::KeyValue<supermap::Key<128ul>,supermap::ByteArray<4096ul>>,std::allocator<supermap::KeyValue<supermap::Key<128ul>,supermap::ByteArray<4096ul>>>>
    ::emplace_back<supermap::KeyValue<supermap::Key<128ul>,supermap::ByteArray<4096ul>>>
              ((vector<supermap::KeyValue<supermap::Key<128ul>,supermap::ByteArray<4096ul>>,std::allocator<supermap::KeyValue<supermap::Key<128ul>,supermap::ByteArray<4096ul>>>>
                *)__return_storage_ptr__,&KStack_b8);
    if (KStack_b8.value.data_._M_t.
        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
        (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)0x0) {
      operator_delete__((void *)KStack_b8.value.data_._M_t.
                                super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
    }
  }
  std::
  _Rb_tree<supermap::Key<128UL>,_std::pair<const_supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_std::_Select1st<std::pair<const_supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>_>,_std::less<supermap::Key<128UL>_>,_std::allocator<std::pair<const_supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>_>_>
  ::clear(&(this->map_)._M_t);
  return __return_storage_ptr__;
}

Assistant:

std::vector<KeyValue<Key, Value>> extract() && override {
        std::vector<KeyValue<Key, Value>>
            extracted;
        for (auto &&[k, v] : map_) {
            extracted.emplace_back(KeyValue(std::move(k), std::move(v)));
        }
        map_.clear();
        return extracted;
    }